

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Stress::(anonymous_namespace)::TextureCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  undefined1 local_1a8 [8];
  ostringstream buf;
  allocator<char> local_19;
  void *local_18;
  TextureCase *this_local;
  
  local_18 = this;
  this_local = (TextureCase *)__return_storage_ptr__;
  if (*(int *)((long)this + 0x84) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_out;\nvoid main ()\n{\n\tfragColor = v_out;\n}\n"
               ,&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::operator<<((ostream *)local_1a8,
                    "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;\n");
    if (*(int *)((long)this + 0x88) == 0) {
      std::operator<<((ostream *)local_1a8,"uniform highp sampler2D u_sampler;\n");
    }
    else if (*(int *)((long)this + 0x88) == 1) {
      std::operator<<((ostream *)local_1a8,"uniform highp sampler2DShadow u_sampler;\n");
    }
    std::operator<<((ostream *)local_1a8,"in highp vec4 v_attr;\nvoid main ()\n{\n");
    if (*(int *)((long)this + 0x88) == 0) {
      std::operator<<((ostream *)local_1a8,
                      "\thighp vec2 a1 = texture(u_sampler, v_attr.xy).rg;\n\tfragColor = vec4(a1.x, a1.y, 1.0, 1.0);\n"
                     );
    }
    else if (*(int *)((long)this + 0x88) == 1) {
      std::operator<<((ostream *)local_1a8,
                      "\thighp float a1 = texture(u_sampler, vec3(v_attr.xy, 0.0));\n\tfragColor = vec4(a1, (a1 > 1.0 || a1 < 0.0) ? (0.0) : (1.0), 1.0, 1.0);\n"
                     );
    }
    std::operator<<((ostream *)local_1a8,"}\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextureCase::genFragmentSource (void) const
{
	// fragment shader is passthrough
	if (m_type == TYPE_VERTEX)
		return s_colorPassthroughFragmentShaderSource;

	// fragment shader does the calculations
	std::ostringstream buf;
	buf <<	"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;\n";

	if (m_textureType == TEXTURE_FLOAT)
		buf <<	"uniform highp sampler2D u_sampler;\n";
	else if (m_textureType == TEXTURE_DEPTH)
		buf <<	"uniform highp sampler2DShadow u_sampler;\n";
	else
		DE_ASSERT(DE_FALSE);

	buf <<	"in highp vec4 v_attr;\n"
			"void main ()\n"
			"{\n";

	if (m_textureType == TEXTURE_FLOAT)
		buf <<	"	highp vec2 a1 = texture(u_sampler, v_attr.xy).rg;\n"
				"	fragColor = vec4(a1.x, a1.y, 1.0, 1.0);\n";
	else if (m_textureType == TEXTURE_DEPTH)
		buf <<	"	highp float a1 = texture(u_sampler, vec3(v_attr.xy, 0.0));\n"
				"	fragColor = vec4(a1, (a1 > 1.0 || a1 < 0.0) ? (0.0) : (1.0), 1.0, 1.0);\n";
	else
		DE_ASSERT(DE_FALSE);

	buf << "}\n";
	return buf.str();
}